

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

void __thiscall QPanGesture::QPanGesture(QPanGesture *this,QObject *parent)

{
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0xf0);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined4 *)(this_00 + 0x78) = 0x100;
  *(undefined8 *)(this_00 + 0x7c) = 0;
  *(undefined8 *)(this_00 + 0x84) = 0;
  *(undefined8 *)(this_00 + 0x8c) = 0;
  *(undefined8 *)(this_00 + 0x94) = 0;
  *(undefined4 *)(this_00 + 0x9c) = 0;
  this_00[0xa0] = (QObjectPrivate)((byte)this_00[0xa0] & 0xf8);
  *(undefined ***)this_00 = &PTR__QObjectPrivate_007f45c8;
  *(undefined8 *)(this_00 + 0xa8) = 0;
  *(undefined8 *)(this_00 + 0xb0) = 0;
  *(undefined8 *)(this_00 + 0xb8) = 0;
  *(undefined8 *)(this_00 + 0xc0) = 0;
  *(undefined8 *)(this_00 + 200) = 0;
  *(undefined8 *)(this_00 + 0xd0) = 0;
  *(undefined8 *)(this_00 + 0xd8) = 0;
  *(undefined8 *)(this_00 + 0xe0) = 0;
  *(undefined4 *)(this_00 + 0xe8) = 2;
  QObject::QObject((QObject *)this,this_00,parent);
  *(undefined ***)&this->super_QGesture = &PTR_metaObject_007f4000;
  *(undefined4 *)(*(long *)&(this->super_QGesture).field_0x8 + 0x78) = 3;
  return;
}

Assistant:

QPanGesture::QPanGesture(QObject *parent)
    : QGesture(*new QPanGesturePrivate, parent)
{
    d_func()->gestureType = Qt::PanGesture;
}